

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

ExpectedStats * phmap::priv::anon_unknown_0::XorSeedExpectedStats(void)

{
  initializer_list<std::pair<double,_double>_> __l;
  initializer_list<std::pair<double,_double>_> __l_00;
  ExpectedStats *in_RDI;
  allocator<std::pair<double,_double>_> local_ed;
  int local_ec;
  double local_e8;
  int local_dc;
  double local_d8;
  int local_cc;
  double local_c8;
  int local_bc;
  double local_b8;
  pair<double,_double> local_b0;
  pair<double,_double> local_a0;
  pair<double,_double> local_90;
  pair<double,_double> local_80;
  iterator local_70;
  size_type local_68;
  allocator<std::pair<double,_double>_> local_49;
  double local_48;
  double local_40;
  pair<double,_double> local_38;
  pair<double,_double> *local_28;
  size_type local_20;
  undefined1 local_11;
  bool kRandomizesInserts;
  
  local_11 = 1;
  in_RDI->avg_ratio = 0.1;
  in_RDI->max_ratio = 1.0;
  local_40 = 0.95;
  local_48 = 0.1;
  std::pair<double,_double>::pair<double,_double,_true>(&local_38,&local_40,&local_48);
  local_20 = 1;
  local_28 = &local_38;
  std::allocator<std::pair<double,_double>_>::allocator(&local_49);
  __l_00._M_len = local_20;
  __l_00._M_array = local_28;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&in_RDI->pecentile_ratios,__l_00,&local_49);
  local_b8 = 0.95;
  local_bc = 0;
  std::pair<double,_double>::pair<double,_int,_true>(&local_b0,&local_b8,&local_bc);
  local_c8 = 0.99;
  local_cc = 1;
  std::pair<double,_double>::pair<double,_int,_true>(&local_a0,&local_c8,&local_cc);
  local_d8 = 0.999;
  local_dc = 8;
  std::pair<double,_double>::pair<double,_int,_true>(&local_90,&local_d8,&local_dc);
  local_e8 = 0.9999;
  local_ec = 0xf;
  std::pair<double,_double>::pair<double,_int,_true>(&local_80,&local_e8,&local_ec);
  local_70 = &local_b0;
  local_68 = 4;
  std::allocator<std::pair<double,_double>_>::allocator(&local_ed);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&in_RDI->pecentile_probes,__l,&local_ed);
  std::allocator<std::pair<double,_double>_>::~allocator(&local_ed);
  std::allocator<std::pair<double,_double>_>::~allocator(&local_49);
  return in_RDI;
}

Assistant:

ExpectedStats XorSeedExpectedStats() {
  constexpr bool kRandomizesInserts =
#ifdef NDEBUG
      false;
#else   // NDEBUG
      true;
#endif  // NDEBUG

  // The effective load factor is larger in non-opt mode because we insert
  // elements out of order.
  PHMAP_IF_CONSTEXPR (priv::Group::kWidth == 8) {
      if (kRandomizesInserts) {
          return {0.05,
                  1.0,
                  {{0.95, 0.5}},
                  {{0.95, 0}, {0.99, 2}, {0.999, 4}, {0.9999, 10}}};
      } else {
          return {0.05,
                  2.0,
                  {{0.95, 0.1}},
                  {{0.95, 0}, {0.99, 2}, {0.999, 4}, {0.9999, 10}}};
      }
  }
  else {
      if (kRandomizesInserts) {
          return {0.1,
                  1.0,
                  {{0.95, 0.1}},
                  {{0.95, 0}, {0.99, 1}, {0.999, 8}, {0.9999, 15}}};
      } else {
          return {0.05,
                  1.0,
                  {{0.95, 0.05}},
                  {{0.95, 0}, {0.99, 1}, {0.999, 4}, {0.9999, 10}}};
      }
  }
  //PHMAP_RAW_LOG(FATAL, "%s", "Unknown Group width");
  return {};
}